

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

crn_bool crnlib::texture_conversion::crn_progress_callback
                   (crn_uint32 phase_index,crn_uint32 total_phases,crn_uint32 subphase_index,
                   crn_uint32 total_subphases,void *pUser_data_ptr)

{
  int iVar1;
  ulong uVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  long *in_R8;
  int percentage_complete;
  progress_params *params;
  crn_bool local_4;
  
  if ((*(byte *)((long)in_R8 + 0xc) & 1) == 0) {
    if (*(long *)(*in_R8 + 0x3f8) == 0) {
      local_4 = 1;
    }
    else {
      iVar1 = math::clamp<int>(*(uint *)(in_R8 + 1) +
                               (int)((((float)in_EDI + (float)in_EDX / (float)in_ECX) *
                                     (100.0 - (float)*(uint *)(in_R8 + 1))) / (float)in_ESI + 0.5),0
                               ,100);
      uVar2 = (**(code **)(*in_R8 + 0x3f8))(iVar1,*(undefined8 *)(*in_R8 + 0x400));
      if ((uVar2 & 1) == 0) {
        *(undefined1 *)((long)in_R8 + 0xc) = 1;
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static crn_bool crn_progress_callback(crn_uint32 phase_index, crn_uint32 total_phases, crn_uint32 subphase_index, crn_uint32 total_subphases, void* pUser_data_ptr) {
  progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

  if (params.m_canceled)
    return false;
  if (!params.m_pParams->m_pProgress_func)
    return true;

  int percentage_complete = params.m_start_percentage + (int)(.5f + (phase_index + float(subphase_index) / total_subphases) * (100.0f - params.m_start_percentage) / total_phases);

  percentage_complete = math::clamp<int>(percentage_complete, 0, 100);

  if (!params.m_pParams->m_pProgress_func(percentage_complete, params.m_pParams->m_pProgress_user_data)) {
    params.m_canceled = true;
    return false;
  }

  return true;
}